

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O0

Block * __thiscall
soul::PoolAllocator::
allocate<soul::AST::Block,soul::AST::Context,soul::pool_ptr<soul::AST::Function>&>
          (PoolAllocator *this,Context *args,pool_ptr<soul::AST::Function> *args_1)

{
  DestructorFn *pDVar1;
  Context *this_00;
  _lambda_void___1_ local_45 [13];
  pool_ptr<soul::AST::Function> local_38;
  Block *local_30;
  Block *newObject;
  PoolItem *newItem;
  pool_ptr<soul::AST::Function> *args_local_1;
  Context *args_local;
  PoolAllocator *this_local;
  
  newItem = (PoolItem *)args_1;
  args_local_1 = (pool_ptr<soul::AST::Function> *)args;
  args_local = (Context *)this;
  newObject = (Block *)allocateSpaceForObject(this,0x50);
  this_00 = &(newObject->super_Statement).super_ASTObject.context;
  local_38.object = (Function *)newItem->size;
  AST::Block::Block((Block *)this_00,(Context *)args_local_1,&local_38);
  pool_ptr<soul::AST::Function>::~pool_ptr(&local_38);
  local_30 = (Block *)this_00;
  pDVar1 = allocate(soul::AST::Context&&,soul::pool_ptr&)::{lambda(void*)#1}::
           operator_cast_to_function_pointer(local_45);
  *(DestructorFn **)&(newObject->super_Statement).super_ASTObject.objectType = pDVar1;
  return local_30;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }